

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryption.cc
# Opt level: O1

encryption_ops * get_encryption_ops(fdb_encryption_algorithm_t algorithm)

{
  encryption_ops **ppeVar1;
  
  if (algorithm == -1) {
    ppeVar1 = &fdb_encryption_ops_bogus;
  }
  else {
    if (algorithm != 1) {
      return (encryption_ops *)0x0;
    }
    ppeVar1 = &fdb_encryption_ops_aes;
  }
  return *ppeVar1;
}

Assistant:

const encryption_ops* get_encryption_ops(fdb_encryption_algorithm_t algorithm) {
    switch (algorithm) {
        case FDB_ENCRYPTION_AES256:
            return fdb_encryption_ops_aes;
        case FDB_ENCRYPTION_BOGUS:
            return fdb_encryption_ops_bogus;
        default:
            return NULL;
    }
}